

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

void Function_Pool::Resize
               (Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,uint32_t heightIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,uint32_t heightOut
               )

{
  FunctionTask local_170;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,widthIn,heightIn);
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,widthOut,heightOut);
  FunctionTask::FunctionTask(&local_170);
  FunctionTask::Resize
            (&local_170,in,startXIn,startYIn,widthIn,heightIn,out,startXOut,startYOut,widthOut,
             heightOut);
  FunctionTask::~FunctionTask(&local_170);
  return;
}

Assistant:

void Resize( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                 Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        Image_Function::ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        Image_Function::ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );

        FunctionTask().Resize( in, startXIn, startYIn, widthIn, heightIn, out, startXOut, startYOut, widthOut, heightOut );
    }